

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::SignLayerParams::CheckTypeAndMergeFrom
          (SignLayerParams *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__SignLayerParams_0048c320) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::SignLayerParams *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((SignLayerParams *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xd236);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  uVar1 = (from->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}